

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::Token>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::Token> *this,double t)

{
  Sample local_48;
  
  local_48.value.str_._M_dataplus._M_p = (pointer)&local_48.value.str_.field_2;
  local_48.value.str_._M_string_length = 0;
  local_48.value.str_.field_2._M_local_buf[0] = '\0';
  local_48.blocked = true;
  local_48.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>>
              *)this,&local_48);
  this->_dirty = true;
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }